

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  data_ptr_t pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<double>_>_&)>
  _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  idx_t size;
  ulong uVar7;
  long lVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  idx_t iVar10;
  undefined8 *puVar11;
  idx_t iVar12;
  long lVar13;
  ulong uVar14;
  UnifiedVectorFormat state_format;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<double>_>_&)>
  local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  ulong local_a8;
  Vector *local_a0;
  buffer_ptr<ValidityBuffer> *local_98;
  data_ptr_t local_90;
  idx_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_88 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  if (count == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = 0;
    iVar10 = 0;
    do {
      iVar12 = iVar10;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)(local_78.sel)->sel_vector[iVar10];
      }
      lVar13 = lVar13 + *(long *)(*(long *)(local_78.data + iVar12 * 8) + 0x10);
      iVar10 = iVar10 + 1;
    } while (count != iVar10);
  }
  ListVector::Reserve(result,lVar13 + size);
  local_90 = result->data;
  local_a0 = ListVector::GetEntry(result);
  if (count != 0) {
    local_98 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar14 = 0;
    local_a8 = count;
    do {
      uVar7 = uVar14;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)(local_78.sel)->sel_vector[uVar14];
      }
      uVar1 = uVar14 + local_88;
      lVar13 = *(long *)(local_78.data + uVar7 * 8);
      if ((*(char *)(lVar13 + 0x18) == '\x01') && (lVar8 = *(long *)(lVar13 + 0x10), lVar8 != 0)) {
        *(idx_t *)(local_90 + uVar1 * 0x10) = size;
        *(long *)(local_90 + uVar1 * 0x10 + 8) = lVar8;
        local_b8._M_comp = BinaryAggregateHeap<duckdb::string_t,_double,_duckdb::LessThan>::Compare;
        ::std::
        __sort_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<double>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<double>>const&)>>
                  (*(pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<double>_> **)
                    (lVar13 + 8),
                   *(pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<double>_> **)
                    (lVar13 + 8) + lVar8,&local_b8);
        lVar8 = *(long *)(lVar13 + 0x10);
        if (lVar8 != 0) {
          pdVar3 = local_a0->data;
          puVar11 = (undefined8 *)(*(long *)(lVar13 + 8) + 0x20);
          do {
            *(undefined8 *)(pdVar3 + size * 8) = *puVar11;
            size = size + 1;
            puVar11 = puVar11 + 5;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
      }
      else {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var6 = p_Stack_b0;
          _Var5._M_comp = local_b8._M_comp;
          local_b8._M_comp =
               (_func_bool_pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<double>_>_ptr_pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<double>_>_ptr
                *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var5._M_comp;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_98);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar4 = (byte)uVar1 & 0x3f;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar1 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar14 = uVar14 + 1;
      count = local_a8;
    } while (uVar14 != local_a8);
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}